

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O3

Uint32 __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::AllocateDynamicBufferId
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this)

{
  SpinLock *this_00;
  atomic<unsigned_int> *paVar1;
  pointer puVar2;
  byte bVar3;
  Uint32 UVar4;
  Uint32 Id;
  
  this_00 = &this->m_RecycledDynamicBufferIdsLock;
  LOCK();
  bVar3 = (this->m_RecycledDynamicBufferIdsLock).m_IsLocked._M_base._M_i;
  (this->m_RecycledDynamicBufferIdsLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  while ((bVar3 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar3 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  puVar2 = (this->m_RecycledDynamicBufferIds).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->m_RecycledDynamicBufferIds).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start == puVar2) {
    LOCK();
    paVar1 = &this->m_NextDynamicBufferId;
    UVar4 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  else {
    UVar4 = puVar2[-1];
    (this->m_RecycledDynamicBufferIds).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2 + -1;
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->m_DbgRecycledDynamicBufferIds)._M_h);
  }
  Threading::SpinLock::unlock(this_00);
  return UVar4;
}

Assistant:

Uint32 AllocateDynamicBufferId()
    {
        Threading::SpinLockGuard Guard{m_RecycledDynamicBufferIdsLock};
        if (!m_RecycledDynamicBufferIds.empty())
        {
            Uint32 Id = m_RecycledDynamicBufferIds.back();
            m_RecycledDynamicBufferIds.pop_back();
#ifdef DILIGENT_DEBUG
            m_DbgRecycledDynamicBufferIds.erase(Id);
#endif
            return Id;
        }
        else
        {
            return m_NextDynamicBufferId.fetch_add(1);
        }
    }